

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::skipElementsBySomeUnits
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t count)

{
  bool bVar1;
  long lVar2;
  UChar UVar3;
  UChar UVar4;
  
  do {
    UVar3 = UCharsTrieElement::charAt(this->elements + i,unitIndex,&this->strings);
    lVar2 = (long)i * 8;
    do {
      UVar4 = UCharsTrieElement::charAt
                        ((UCharsTrieElement *)((long)&this->elements[1].stringOffset + lVar2),
                         unitIndex,&this->strings);
      i = i + 1;
      lVar2 = lVar2 + 8;
    } while (UVar3 == UVar4);
    bVar1 = 1 < count;
    count = count + -1;
  } while (bVar1);
  return i;
}

Assistant:

int32_t
UCharsTrieBuilder::skipElementsBySomeUnits(int32_t i, int32_t unitIndex, int32_t count) const {
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
    } while(--count>0);
    return i;
}